

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_unicode_filenames.cc
# Opt level: O2

int main(int argc,char **argv)

{
  ostream *poVar1;
  
  copy((EVP_PKEY_CTX *)anon_var_dwarf_72b,(EVP_PKEY_CTX *)argv);
  copy((EVP_PKEY_CTX *)anon_var_dwarf_735,(EVP_PKEY_CTX *)argv);
  poVar1 = std::operator<<((ostream *)&std::cout,"created Unicode filenames");
  std::endl<char,std::char_traits<char>>(poVar1);
  return 0;
}

Assistant:

int
main(int argc, char* argv[])
{
    // Explicit UTF-8 encoding
    char const* f1 = "auto-\xc3\xbc.pdf";
    char const* f2 = "auto-\xc3\xb6\xcf\x80.pdf";
    copy(f1);
    copy(f2);
    std::cout << "created Unicode filenames" << std::endl;
    return 0;
}